

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t spvtools::val::MergeBlockAssert(ValidationState_t *_,uint32_t merge_block)

{
  ValidationState_t *this;
  bool bVar1;
  uint32_t id;
  Function *pFVar2;
  Instruction *inst;
  DiagnosticStream *pDVar3;
  string local_218;
  DiagnosticStream local_1f8;
  uint32_t local_1c;
  ValidationState_t *pVStack_18;
  uint32_t merge_block_local;
  ValidationState_t *__local;
  
  local_1c = merge_block;
  pVStack_18 = _;
  pFVar2 = ValidationState_t::current_function(_);
  bVar1 = Function::IsBlockType(pFVar2,local_1c,kBlockTypeMerge);
  this = pVStack_18;
  if (bVar1) {
    pFVar2 = ValidationState_t::current_function(pVStack_18);
    id = Function::id(pFVar2);
    inst = ValidationState_t::FindDef(this,id);
    ValidationState_t::diag(&local_1f8,this,SPV_ERROR_INVALID_CFG,inst);
    pDVar3 = DiagnosticStream::operator<<(&local_1f8,(char (*) [7])0xf30b46);
    ValidationState_t::getIdName_abi_cxx11_(&local_218,pVStack_18,local_1c);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_218);
    pDVar3 = DiagnosticStream::operator<<
                       (pDVar3,(char (*) [45])" is already a merge block for another header");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    std::__cxx11::string::~string((string *)&local_218);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  else {
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t MergeBlockAssert(ValidationState_t& _, uint32_t merge_block) {
  if (_.current_function().IsBlockType(merge_block, kBlockTypeMerge)) {
    return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(_.current_function().id()))
           << "Block " << _.getIdName(merge_block)
           << " is already a merge block for another header";
  }
  return SPV_SUCCESS;
}